

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::FeedbackPrimitiveTypeCase::
getVertexSource_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  RenderContext *pRVar1;
  ContextType local_50 [5];
  allocator<char> local_39;
  string local_38;
  void *local_18;
  FeedbackPrimitiveTypeCase *this_local;
  
  local_18 = this;
  this_local = (FeedbackPrimitiveTypeCase *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "${VERSION_DECL}\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,&local_39);
  pRVar1 = gles31::Context::getRenderContext(*(Context **)((long)this + 0x70));
  local_50[0].super_ApiType.m_bits = (ApiType)(*pRVar1->_vptr_RenderContext[2])();
  anon_unknown_1::specializeShader(__return_storage_ptr__,&local_38,local_50);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string FeedbackPrimitiveTypeCase::getVertexSource (void) const
{
	return specializeShader(s_positionVertexShader, m_context.getRenderContext().getType());
}